

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

QExpression * __thiscall
Qentem::Array<Qentem::QExpression>::allocate(Array<Qentem::QExpression> *this)

{
  QExpression *pointer;
  
  pointer = (QExpression *)operator_new((ulong)this->capacity_ * 0x18);
  MemoryRecord::AddAllocation(pointer);
  this->storage_ = pointer;
  return pointer;
}

Assistant:

Type_T *allocate() {
        Type_T *new_storage = Memory::Allocate<Type_T>(Capacity());
        setStorage(new_storage);
        return new_storage;
    }